

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *this)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  locale *plVar5;
  basic_format_specs<char> *pbVar6;
  bool bVar7;
  char cVar8;
  uint uVar9;
  uint uVar10;
  numpunct *pnVar11;
  buffer_appender<char> bVar12;
  ulong uVar13;
  long *plVar14;
  long *plVar15;
  char *pcVar16;
  long *plVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  char *pcVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  buffer<char> *buf;
  string groups;
  char digits [40];
  long *local_2a8;
  long local_2a0;
  long local_298 [2];
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned_long> *local_288;
  long local_280;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  plVar5 = (locale *)(this->locale).locale_;
  if (plVar5 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar5);
  }
  pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  (**(code **)(*(long *)pnVar11 + 0x20))(&local_2a8,pnVar11);
  std::locale::~locale((locale *)&local_248);
  if (local_2a0 == 0) {
    on_dec(this);
  }
  else {
    plVar5 = (locale *)(this->locale).locale_;
    if (plVar5 == (locale *)0x0) {
      std::locale::locale((locale *)&local_248);
    }
    else {
      std::locale::locale((locale *)&local_248,plVar5);
    }
    pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
    cVar8 = (**(code **)(*(long *)pnVar11 + 0x18))(pnVar11);
    std::locale::~locale((locale *)&local_248);
    if (cVar8 == '\0') {
      on_dec(this);
    }
    else {
      uVar24 = this->abs_value;
      lVar18 = 0x3f;
      if ((uVar24 | 1) != 0) {
        for (; (uVar24 | 1) >> lVar18 == 0; lVar18 = lVar18 + -1) {
        }
      }
      uVar4 = *(ushort *)(bsr2log10(int)::data + (uint)((int)lVar18 * 2));
      uVar22 = (uint)uVar4 -
               (uint)(uVar24 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64_new +
                                         (ulong)uVar4 * 8));
      iVar25 = -(uint)(uVar24 < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64_new +
                                          (ulong)uVar4 * 8));
      plVar17 = (long *)((long)local_2a8 + local_2a0);
      plVar15 = local_2a8;
      uVar10 = uVar22;
      uVar9 = uVar22;
      if (local_2a0 != 0) {
        plVar14 = local_2a8;
        lVar18 = local_2a0;
        uVar23 = uVar22;
        do {
          cVar2 = (char)*plVar14;
          uVar20 = uVar9 - (int)cVar2;
          plVar15 = plVar14;
          uVar10 = uVar23;
          if ((uVar20 == 0 || (int)uVar9 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82)) break;
          uVar23 = uVar23 + 1;
          plVar14 = (long *)((long)plVar14 + 1);
          lVar18 = lVar18 + -1;
          plVar15 = plVar17;
          uVar10 = (int)local_2a0 + iVar25 + (uint)uVar4;
          uVar9 = uVar20;
        } while (lVar18 != 0);
      }
      if (plVar15 == plVar17) {
        uVar10 = (int)(uVar9 - 1) / (int)*(char *)((long)plVar17 + -1) + uVar10;
      }
      pcVar16 = local_278 + (int)uVar22;
      uVar13 = uVar24;
      if (99 < uVar24) {
        do {
          uVar13 = uVar24 / 100;
          *(undefined2 *)(pcVar16 + -2) =
               *(undefined2 *)(basic_data<void>::digits + (uVar24 % 100) * 2);
          pcVar16 = pcVar16 + -2;
          bVar7 = 9999 < uVar24;
          uVar24 = uVar13;
        } while (bVar7);
      }
      if (uVar13 < 10) {
        pcVar16[-1] = (byte)uVar13 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar16 + -2) = *(undefined2 *)(basic_data<void>::digits + uVar13 * 2);
      }
      local_248.super_buffer<char>.size_ = 0;
      local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0013d750;
      local_248.super_buffer<char>.ptr_ = local_248.store_;
      local_248.super_buffer<char>.capacity_ = 500;
      uVar10 = uVar10 + this->prefix_size;
      uVar24 = (ulong)uVar10;
      if (500 < uVar10) {
        basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar24);
      }
      pcVar16 = local_248.super_buffer<char>.ptr_;
      local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
      if (uVar24 <= local_248.super_buffer<char>.capacity_) {
        local_248.super_buffer<char>.size_ = uVar24;
      }
      local_280 = (long)(int)uVar10;
      pcVar21 = local_248.super_buffer<char>.ptr_ + local_280 + -1;
      if (1 < (int)uVar22) {
        uVar13 = (ulong)uVar22;
        iVar19 = iVar25 + (uint)uVar4 + 1;
        iVar25 = 0;
        plVar17 = local_2a8;
        do {
          uVar13 = uVar13 - 1;
          pcVar1 = pcVar21 + -1;
          *pcVar21 = local_278[uVar13 & 0xffffffff];
          cVar2 = (char)*plVar17;
          if ('\0' < cVar2) {
            iVar25 = iVar25 + 1;
            if ((cVar2 != '\x7f') && (iVar25 % (int)cVar2 == 0)) {
              if ((long *)((long)plVar17 + 1) != (long *)((long)local_2a8 + local_2a0)) {
                iVar25 = 0;
                plVar17 = (long *)((long)plVar17 + 1);
              }
              pcVar21[-1] = cVar8;
              pcVar1 = pcVar21 + -2;
            }
          }
          pcVar21 = pcVar1;
          iVar19 = iVar19 + -1;
        } while (2 < iVar19);
      }
      *pcVar21 = local_278[0];
      if (this->prefix_size != 0) {
        pcVar21[-1] = '-';
      }
      pbVar6 = this->specs;
      uVar13 = 0;
      if (uVar24 <= (uint)pbVar6->width) {
        uVar13 = (uint)pbVar6->width - uVar24;
      }
      bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      bVar3 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                       (ulong)((byte)pbVar6->field_0x9 & 0xf));
      local_288 = this;
      if (*(ulong *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                           container + 0x18) <
          *(long *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                          container + 0x10) + uVar24 + (pbVar6->fill).size_ * uVar13) {
        (*(code *)**(undefined8 **)
                    bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      uVar24 = uVar13 >> (bVar3 & 0x3f);
      bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar12,uVar24,&pbVar6->fill);
      bVar12 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                         (pcVar16,pcVar16 + local_280,bVar12);
      bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>
                         (bVar12,uVar13 - uVar24,&pbVar6->fill);
      (local_288->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           (buffer<char> *)
           bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
      }
    }
  }
  if (local_2a8 != local_298) {
    operator_delete(local_2a8,local_298[0] + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }